

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  Descriptor *pDVar3;
  char *pcVar4;
  int __c;
  int __c_00;
  int __c_01;
  value_type_conflict2 *pvVar5;
  value_type_conflict2 local_30 [3];
  value_type_conflict2 local_24;
  value_type_conflict2 local_20 [2];
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  FieldDescriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  bVar2 = is_extension(this);
  if (bVar2) {
    pDVar3 = extension_scope(this);
    if (pDVar3 == (Descriptor *)0x0) {
      local_20[1] = 7;
      pvVar5 = local_20 + 1;
      std::vector<int,_std::allocator<int>_>::push_back(local_18,pvVar5);
      pvVar1 = local_18;
      pcVar4 = index(this,(char *)pvVar5,__c);
      local_20[0] = (value_type_conflict2)pcVar4;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar1,local_20);
    }
    else {
      pDVar3 = extension_scope(this);
      Descriptor::GetLocationPath(pDVar3,local_18);
      local_24 = 6;
      pvVar5 = &local_24;
      std::vector<int,_std::allocator<int>_>::push_back(local_18,pvVar5);
      pvVar1 = local_18;
      pcVar4 = index(this,(char *)pvVar5,__c_00);
      local_30[2] = (value_type_conflict2)pcVar4;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar1,local_30 + 2);
    }
  }
  else {
    pDVar3 = containing_type(this);
    Descriptor::GetLocationPath(pDVar3,local_18);
    local_30[1] = 2;
    pvVar5 = local_30 + 1;
    std::vector<int,_std::allocator<int>_>::push_back(local_18,pvVar5);
    pvVar1 = local_18;
    pcVar4 = index(this,(char *)pvVar5,__c_01);
    local_30[0] = (value_type_conflict2)pcVar4;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,local_30);
  }
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (is_extension()) {
    if (extension_scope() == nullptr) {
      output->push_back(FileDescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    } else {
      extension_scope()->GetLocationPath(output);
      output->push_back(DescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    }
  } else {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kFieldFieldNumber);
    output->push_back(index());
  }
}